

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall Math_InnerProduct_Test::TestBody(Math_InnerProduct_Test *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *message;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar29 [32];
  undefined1 auVar33 [64];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  Float dab;
  Float ab;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  float local_180;
  float local_17c;
  undefined1 local_178 [16];
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  internal local_148 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  ushort local_138;
  undefined6 uStack_136;
  undefined8 uStack_130;
  ushort local_128;
  undefined6 uStack_126;
  undefined8 uStack_120;
  ushort local_118;
  undefined6 uStack_116;
  undefined8 uStack_110;
  undefined8 local_108;
  uint uStack_100;
  uint uStack_fc;
  undefined8 local_f8;
  uint uStack_f0;
  uint uStack_ec;
  ulong local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  undefined1 *local_80;
  long local_78;
  AssertHelper local_70;
  undefined1 local_68 [32];
  double local_48;
  undefined8 uStack_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_90 = -0x77324800ac6f179c;
  local_98 = 0x6c0356a743cf3fcf;
  local_a0 = -0x5476b7974c4fb03a;
  local_a8 = 0x502959d812b031f9;
  local_b0 = -0x6574808725910b28;
  local_c0 = 0x30705b042917ec1a;
  local_d0 = -0x344a09b9bfb5a9f4;
  local_d8 = -0x3f4e7330b1dad2e9;
  local_e0 = 0;
  local_158 = -0x27cbe0322140350;
  local_80 = &DAT_5851f42d4c957f2e;
  local_150 = -0x751e902698b9450f;
  local_160 = 0x70a3a52b7c609632;
  local_88 = -0x571b450ef568cb35;
  local_c8 = -0x38fcced62d42ebe3;
  local_78 = 1;
  local_168 = -0x4b882bc07a098a6b;
  local_b8 = 0x20fd5db43a776693;
  do {
    uVar14 = (local_e0 >> 0x1b ^ local_e0) * -0x7e25210b43d22bb3;
    uVar14 = uVar14 >> 0x21 ^ uVar14;
    local_108 = uVar14 * 0x685f98a2018fade9 + local_d8;
    local_f8 = uVar14 * -0x4b2c51c6d8d41ef + local_c8;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_80 + uVar14 * 0x5851f42d4c957f2d;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar14 * 0xb046976f22528f5 + local_d0;
    auVar27 = vpunpcklqdq_avx(auVar51,auVar35);
    uVar19 = uVar14 * -0xf72fd4feea08587 + local_b8;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar14 * 0x696d29da565ad7fd + local_c0;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar14 * 0x798e21c49ff78e45 + local_b0;
    auVar37 = vpunpcklqdq_avx(auVar65,auVar61);
    uVar18 = uVar14 * -0x4a6225a0c7bec2df + local_a8;
    auVar28._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar37;
    auVar28._16_16_ = ZEXT116(1) * auVar27;
    uVar15 = uVar14 * 0x2baa1c4032658d31 + local_168;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar14 * 0x5b5fee90a1001dcd + local_a0;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar14 * 0x1cca61580fc1a895 + local_90;
    auVar27 = vpunpcklqdq_avx(auVar66,auVar52);
    uVar17 = uVar14 * -0x3f85f1c16fe10ff7 + local_98;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar14 * -0x43d42f140995df63 + local_160;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar14 * 0x549e870bd354c7e5 + local_158;
    auVar37 = vpunpcklqdq_avx(auVar67,auVar62);
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x2d1b2d1b2d1b2d1b));
    auVar31 = vinserti64x4_avx512f
                        (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar27,
                                             ZEXT116(0) * auVar27 + ZEXT116(1) * auVar37)),auVar28,1
                        );
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x1b2d1b2d1b2d1b2d));
    uVar16 = uVar14 * 0x384115c58e369e99 + local_88;
    auVar30 = vpsrlvq_avx512f(auVar31,auVar30);
    auVar32 = vpsrlvq_avx512f(auVar31,auVar32);
    auVar31 = vpsrlq_avx512f(auVar31,0x3b);
    auVar30 = vpxorq_avx512f(auVar30,auVar32);
    auVar28 = vpmovqd_avx512f(auVar31);
    auVar29 = vpmovqd_avx512f(auVar30);
    auVar28 = vprorvd_avx512vl(auVar29,auVar28);
    auVar28 = vcvtudq2ps_avx512vl(auVar28);
    local_68._4_4_ = auVar28._4_4_ * 2.3283064e-10;
    local_68._0_4_ = auVar28._0_4_ * 2.3283064e-10;
    local_68._8_4_ = auVar28._8_4_ * 2.3283064e-10;
    local_68._12_4_ = auVar28._12_4_ * 2.3283064e-10;
    local_68._16_4_ = auVar28._16_4_ * 2.3283064e-10;
    local_68._20_4_ = auVar28._20_4_ * 2.3283064e-10;
    local_68._24_4_ = auVar28._24_4_ * 2.3283064e-10;
    local_68._28_4_ = 0x2f800000;
    auVar29._8_4_ = 0x3f7fffff;
    auVar29._0_8_ = 0x3f7fffff3f7fffff;
    auVar29._12_4_ = 0x3f7fffff;
    auVar29._16_4_ = 0x3f7fffff;
    auVar29._20_4_ = 0x3f7fffff;
    auVar29._24_4_ = 0x3f7fffff;
    auVar29._28_4_ = 0x3f7fffff;
    uVar20 = vcmpps_avx512vl(local_68,auVar29,1);
    local_178 = local_68._16_16_;
    local_118 = (ushort)(uVar20 >> 1) & 0x7f;
    auVar27 = vshufps_avx(local_178,local_178,0xff);
    bVar21 = (byte)uVar20;
    local_138 = (ushort)(bVar21 >> 5);
    fVar22 = (float)((uint)(bVar21 >> 7) * auVar27._0_4_ + (uint)!(bool)(bVar21 >> 7) * 0x3f7fffff);
    local_128 = (ushort)(bVar21 >> 6);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),SUB6416(ZEXT464(0xc1200000),0),
                              ZEXT416((uint)(1.0 - fVar22)));
    local_48 = pow(10.0,(double)auVar27._0_4_);
    auVar27 = vpermilpd_avx(local_178,1);
    fVar22 = (float)((uint)((byte)local_128 & 1) * auVar27._0_4_ +
                    (uint)!(bool)((byte)local_128 & 1) * 0x3f7fffff);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),ZEXT416((uint)(1.0 - fVar22)),
                              ZEXT416(0xc1200000));
    uStack_40 = extraout_XMM0_Qb;
    dVar34 = pow(10.0,(double)auVar27._0_4_);
    local_128 = SUB82(dVar34,0);
    uStack_126 = (undefined6)((ulong)dVar34 >> 0x10);
    auVar27 = vmovshdup_avx(local_178);
    fVar22 = (float)((uint)((byte)local_138 & 1) * auVar27._0_4_ +
                    (uint)!(bool)((byte)local_138 & 1) * 0x3f7fffff);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),ZEXT416((uint)(1.0 - fVar22)),
                              ZEXT416(0xc1200000));
    uStack_120 = extraout_XMM0_Qb_00;
    dVar34 = pow(10.0,(double)auVar27._0_4_);
    local_138 = SUB82(dVar34,0);
    uStack_136 = (undefined6)((ulong)dVar34 >> 0x10);
    fVar22 = (float)((uint)(bVar21 >> 4 & 1) * local_178._0_4_ +
                    (uint)!(bool)(bVar21 >> 4 & 1) * 0x3f7fffff);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),ZEXT416((uint)(1.0 - fVar22)),
                              ZEXT416(0xc1200000));
    uStack_130 = extraout_XMM0_Qb_01;
    auVar47._0_8_ = pow(10.0,(double)auVar27._0_4_);
    auVar47._8_56_ = extraout_var;
    auVar27._2_6_ = uStack_136;
    auVar27._0_2_ = local_138;
    auVar27._8_8_ = uStack_130;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1b2d1b2d1b2d1b2d));
    auVar27 = vmovlhps_avx(auVar27,auVar47._0_16_);
    auVar27 = vcvtpd2ps_avx(auVar27);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar18;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar19;
    auVar37 = vpunpcklqdq_avx(auVar53,auVar36);
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x2d1b2d1b2d1b2d1b));
    auVar23 = vpsrlvq_avx2(auVar37,auVar30._0_16_);
    auVar6 = vpsrlvq_avx2(auVar37,auVar31._0_16_);
    auVar37 = vpsrlq_avx(auVar37,0x3b);
    auVar37 = vpshufd_avx(auVar37,0xe8);
    auVar23 = vpshufd_avx(auVar6 ^ auVar23,0xe8);
    auVar37 = vprorvd_avx512vl(auVar23,auVar37);
    auVar37 = vcvtudq2ps_avx512vl(auVar37);
    auVar38._0_4_ = auVar37._0_4_ * 2.3283064e-10;
    auVar38._4_4_ = auVar37._4_4_ * 2.3283064e-10;
    auVar38._8_4_ = auVar37._8_4_ * 2.3283064e-10;
    auVar38._12_4_ = auVar37._12_4_ * 2.3283064e-10;
    auVar54._8_4_ = 0x3f7fffff;
    auVar54._0_8_ = 0x3f7fffff3f7fffff;
    auVar54._12_4_ = 0x3f7fffff;
    auVar37 = vminps_avx(auVar38,auVar54);
    auVar55._8_4_ = 0x3f000000;
    auVar55._0_8_ = 0x3f0000003f000000;
    auVar55._12_4_ = 0x3f000000;
    uVar20 = vcmpps_avx512vl(auVar37,auVar55,1);
    auVar39._8_4_ = 0x80000000;
    auVar39._0_8_ = 0x8000000080000000;
    auVar39._12_4_ = 0x80000000;
    auVar23 = vxorps_avx512vl(auVar27,auVar39);
    bVar13 = (bool)((byte)uVar20 & 1);
    bVar1 = (bool)((byte)(uVar20 >> 1) & 1);
    bVar2 = (bool)((byte)(uVar20 >> 2) & 1);
    bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar37 = vpermilps_avx(local_68._0_16_,0xff);
    local_178._4_4_ = (uint)bVar1 * auVar23._4_4_ | (uint)!bVar1 * auVar27._4_4_;
    local_178._0_4_ = (uint)bVar13 * auVar23._0_4_ | (uint)!bVar13 * auVar27._0_4_;
    local_178._8_4_ = (uint)bVar2 * auVar23._8_4_ | (uint)!bVar2 * auVar27._8_4_;
    local_178._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar27._12_4_;
    fVar22 = (float)((uint)(bVar21 >> 3 & 1) * auVar37._0_4_ +
                    (uint)!(bool)(bVar21 >> 3 & 1) * 0x3f7fffff);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),ZEXT416((uint)(1.0 - fVar22)),
                              ZEXT416(0xc1200000));
    auVar48._0_8_ = pow(10.0,(double)auVar27._0_4_);
    auVar48._8_56_ = extraout_var_00;
    auVar12._8_8_ = uStack_40;
    auVar12._0_8_ = local_48;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1b2d1b2d1b2d1b2d));
    auVar27 = vmovlhps_avx(auVar12,auVar48._0_16_);
    auVar27 = vcvtpd2ps_avx(auVar27);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar17;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_108;
    auVar37 = vpunpcklqdq_avx(auVar56,auVar40);
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x2d1b2d1b2d1b2d1b));
    auVar23 = vpsrlvq_avx2(auVar37,auVar30._0_16_);
    auVar6 = vpsrlvq_avx2(auVar37,auVar31._0_16_);
    auVar37 = vpsrlq_avx(auVar37,0x3b);
    auVar37 = vpshufd_avx(auVar37,0xe8);
    auVar23 = vpshufd_avx(auVar6 ^ auVar23,0xe8);
    auVar37 = vprorvd_avx512vl(auVar23,auVar37);
    auVar37 = vcvtudq2ps_avx512vl(auVar37);
    auVar41._0_4_ = auVar37._0_4_ * 2.3283064e-10;
    auVar41._4_4_ = auVar37._4_4_ * 2.3283064e-10;
    auVar41._8_4_ = auVar37._8_4_ * 2.3283064e-10;
    auVar41._12_4_ = auVar37._12_4_ * 2.3283064e-10;
    auVar57._8_4_ = 0x3f7fffff;
    auVar57._0_8_ = 0x3f7fffff3f7fffff;
    auVar57._12_4_ = 0x3f7fffff;
    auVar37 = vminps_avx(auVar41,auVar57);
    auVar23._8_4_ = 0x3f000000;
    auVar23._0_8_ = 0x3f0000003f000000;
    auVar23._12_4_ = 0x3f000000;
    uVar20 = vcmpps_avx512vl(auVar37,auVar23,1);
    auVar37 = vpermilpd_avx(local_68._0_16_,1);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar23 = vxorps_avx512vl(auVar27,auVar6);
    bVar13 = (bool)((byte)uVar20 & 1);
    local_108._0_4_ = (uint)bVar13 * auVar23._0_4_ | (uint)!bVar13 * auVar27._0_4_;
    bVar13 = (bool)((byte)(uVar20 >> 1) & 1);
    local_108._4_4_ = (uint)bVar13 * auVar23._4_4_ | (uint)!bVar13 * auVar27._4_4_;
    bVar13 = (bool)((byte)(uVar20 >> 2) & 1);
    uStack_100 = (uint)bVar13 * auVar23._8_4_ | (uint)!bVar13 * auVar27._8_4_;
    bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
    uStack_fc = (uint)bVar13 * auVar23._12_4_ | (uint)!bVar13 * auVar27._12_4_;
    fVar22 = (float)((uint)(bVar21 >> 2 & 1) * auVar37._0_4_ +
                    (uint)!(bool)(bVar21 >> 2 & 1) * 0x3f7fffff);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),ZEXT416((uint)(1.0 - fVar22)),
                              ZEXT416(0xc1200000));
    auVar49._0_8_ = pow(10.0,(double)auVar27._0_4_);
    auVar49._8_56_ = extraout_var_01;
    auVar25._2_6_ = uStack_126;
    auVar25._0_2_ = local_128;
    auVar25._8_8_ = uStack_120;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1b2d1b2d1b2d1b2d));
    auVar27 = vmovlhps_avx(auVar25,auVar49._0_16_);
    auVar27 = vcvtpd2ps_avx(auVar27);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar15;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_f8;
    auVar37 = vpunpcklqdq_avx(auVar58,auVar42);
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x2d1b2d1b2d1b2d1b));
    auVar23 = vpsrlvq_avx2(auVar37,auVar30._0_16_);
    auVar6 = vpsrlvq_avx2(auVar37,auVar31._0_16_);
    auVar37 = vpsrlq_avx(auVar37,0x3b);
    auVar37 = vpshufd_avx(auVar37,0xe8);
    auVar23 = vpshufd_avx(auVar6 ^ auVar23,0xe8);
    auVar37 = vprorvd_avx512vl(auVar23,auVar37);
    auVar37 = vcvtudq2ps_avx512vl(auVar37);
    auVar43._0_4_ = auVar37._0_4_ * 2.3283064e-10;
    auVar43._4_4_ = auVar37._4_4_ * 2.3283064e-10;
    auVar43._8_4_ = auVar37._8_4_ * 2.3283064e-10;
    auVar43._12_4_ = auVar37._12_4_ * 2.3283064e-10;
    auVar59._8_4_ = 0x3f7fffff;
    auVar59._0_8_ = 0x3f7fffff3f7fffff;
    auVar59._12_4_ = 0x3f7fffff;
    auVar37 = vminps_avx(auVar43,auVar59);
    auVar7._8_4_ = 0x3f000000;
    auVar7._0_8_ = 0x3f0000003f000000;
    auVar7._12_4_ = 0x3f000000;
    uVar20 = vcmpps_avx512vl(auVar37,auVar7,1);
    auVar37 = vmovshdup_avx(local_68._0_16_);
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar23 = vxorps_avx512vl(auVar27,auVar8);
    bVar13 = (bool)((byte)uVar20 & 1);
    local_f8._0_4_ = (float)((uint)bVar13 * auVar23._0_4_ | (uint)!bVar13 * auVar27._0_4_);
    bVar13 = (bool)((byte)(uVar20 >> 1) & 1);
    local_f8._4_4_ = (uint)bVar13 * auVar23._4_4_ | (uint)!bVar13 * auVar27._4_4_;
    bVar13 = (bool)((byte)(uVar20 >> 2) & 1);
    uStack_f0 = (uint)bVar13 * auVar23._8_4_ | (uint)!bVar13 * auVar27._8_4_;
    bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
    uStack_ec = (uint)bVar13 * auVar23._12_4_ | (uint)!bVar13 * auVar27._12_4_;
    fVar22 = (float)((uint)((byte)local_118 & 1) * auVar37._0_4_ +
                    (uint)!(bool)((byte)local_118 & 1) * 0x3f7fffff);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),ZEXT416((uint)(1.0 - fVar22)),
                              ZEXT416(0xc1200000));
    dVar34 = pow(10.0,(double)auVar27._0_4_);
    local_118 = SUB82(dVar34,0);
    uStack_116 = (undefined6)((ulong)dVar34 >> 0x10);
    uVar20 = uVar14 * -0x72a1d22376a541bf + local_150;
    fVar22 = (float)((uint)(bVar21 & 1) * local_68._0_4_ + (uint)!(bool)(bVar21 & 1) * 0x3f7fffff);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * 10.0)),ZEXT416((uint)(1.0 - fVar22)),
                              ZEXT416(0xc1200000));
    uStack_110 = extraout_XMM0_Qb_02;
    auVar50._0_8_ = pow(10.0,(double)auVar27._0_4_);
    auVar50._8_56_ = extraout_var_02;
    auVar9._2_6_ = uStack_116;
    auVar9._0_2_ = local_118;
    auVar9._8_8_ = uStack_110;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1b2d1b2d1b2d1b2d));
    auVar11._4_4_ = local_f8._4_4_;
    auVar11._0_4_ = (float)local_f8;
    auVar11._8_4_ = uStack_f0;
    auVar11._12_4_ = uStack_ec;
    auVar10._4_4_ = local_108._4_4_;
    auVar10._0_4_ = (uint)local_108;
    auVar10._8_4_ = uStack_100;
    auVar10._12_4_ = uStack_fc;
    auVar27 = vmovlhps_avx(auVar9,auVar50._0_16_);
    auVar23 = vmovshdup_avx(auVar11);
    auVar6 = vmovshdup_avx(local_178);
    auVar27 = vcvtpd2ps_avx(auVar27);
    fVar5 = (float)local_f8 * auVar23._0_4_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar20;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar16;
    auVar37 = vpunpcklqdq_avx(auVar63,auVar44);
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x2d1b2d1b2d1b2d1b));
    auVar7 = vpsrlvq_avx2(auVar37,auVar30._0_16_);
    auVar8 = vpsrlvq_avx2(auVar37,auVar31._0_16_);
    auVar37 = vpsrlq_avx(auVar37,0x3b);
    auVar37 = vpshufd_avx(auVar37,0xe8);
    auVar7 = vpshufd_avx(auVar8 ^ auVar7,0xe8);
    auVar37 = vprorvd_avx512vl(auVar7,auVar37);
    auVar37 = vcvtudq2ps_avx512vl(auVar37);
    auVar45._0_4_ = auVar37._0_4_ * 2.3283064e-10;
    auVar45._4_4_ = auVar37._4_4_ * 2.3283064e-10;
    auVar45._8_4_ = auVar37._8_4_ * 2.3283064e-10;
    auVar45._12_4_ = auVar37._12_4_ * 2.3283064e-10;
    auVar64._8_4_ = 0x3f7fffff;
    auVar64._0_8_ = 0x3f7fffff3f7fffff;
    auVar64._12_4_ = 0x3f7fffff;
    auVar37 = vminps_avx(auVar45,auVar64);
    auVar24._8_4_ = 0x3f000000;
    auVar24._0_8_ = 0x3f0000003f000000;
    auVar24._12_4_ = 0x3f000000;
    uVar20 = vcmpps_avx512vl(auVar37,auVar24,1);
    auVar37 = vmovshdup_avx512vl(auVar10);
    auVar24 = vmulss_avx512f(auVar10,auVar37);
    auVar7 = vfmsub213ss_fma(auVar23,auVar11,ZEXT416((uint)fVar5));
    auVar68._0_8_ = (double)auVar37._0_4_;
    auVar68._8_8_ = auVar37._8_8_;
    auVar25 = vfmsub213ss_avx512f(auVar37,auVar10,auVar24);
    auVar37._8_4_ = 0x80000000;
    auVar37._0_8_ = 0x8000000080000000;
    auVar37._12_4_ = 0x80000000;
    auVar37 = vxorps_avx512vl(auVar27,auVar37);
    bVar13 = (bool)((byte)uVar20 & 1);
    auVar26._0_4_ = (float)((uint)bVar13 * auVar37._0_4_ | (uint)!bVar13 * auVar27._0_4_);
    bVar13 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar26._4_4_ = (float)((uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar27._4_4_);
    bVar13 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar26._8_4_ = (float)((uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar27._8_4_);
    bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar26._12_4_ = (float)((uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar27._12_4_);
    auVar69._0_4_ = local_178._0_4_ * auVar26._0_4_;
    auVar69._4_4_ = local_178._4_4_ * auVar26._4_4_;
    auVar69._8_4_ = local_178._8_4_ * auVar26._8_4_;
    auVar69._12_4_ = local_178._12_4_ * auVar26._12_4_;
    auVar27 = vmovshdup_avx(auVar26);
    auVar70._0_8_ = (double)auVar26._0_4_;
    auVar70._8_8_ = auVar26._8_8_;
    auVar37 = vmovshdup_avx(auVar69);
    auVar8 = vfmsub213ss_fma(auVar26,local_178,auVar69);
    auVar72._0_8_ = (double)auVar27._0_4_;
    auVar72._8_8_ = auVar27._8_8_;
    fVar71 = auVar37._0_4_;
    fVar22 = fVar71 + auVar69._0_4_;
    auVar27 = vfmsub213ss_fma(auVar27,auVar6,auVar37);
    fVar4 = fVar22 + fVar5;
    local_17c = fVar4 + auVar24._0_4_;
    local_17c = local_17c +
                auVar25._0_4_ +
                (auVar24._0_4_ - (local_17c - fVar4)) + (fVar4 - (local_17c - (local_17c - fVar4)))
                + auVar7._0_4_ +
                  (fVar22 - (fVar4 - (fVar4 - fVar22))) + (fVar5 - (fVar4 - fVar22)) +
                  auVar8._0_4_ +
                  auVar27._0_4_ +
                  (fVar71 - (fVar22 - (fVar22 - fVar71))) + (auVar69._0_4_ - (fVar22 - fVar71));
    auVar31._0_16_ = vcvtss2sd_avx512f(auVar10,auVar10);
    auVar30._0_8_ = auVar31._0_8_;
    auVar30._8_56_ = auVar31._8_56_;
    auVar27 = vcvtss2sd_avx512f(auVar11,auVar11);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = auVar27._0_8_ * (double)auVar23._0_4_;
    auVar27 = vfmadd231sd_fma(auVar60,auVar30._0_16_,auVar68);
    auVar33._0_16_ = vcvtss2sd_avx512f(local_178,local_178);
    auVar33._16_48_ = auVar31._16_48_;
    auVar32._0_8_ = auVar33._0_8_;
    auVar32._8_56_ = auVar33._8_56_;
    auVar27 = vfmadd213sd_fma(auVar70,auVar32._0_16_,auVar27);
    auVar46._0_8_ = (double)auVar6._0_4_;
    auVar46._8_8_ = auVar6._8_8_;
    auVar27 = vfmadd213sd_fma(auVar72,auVar46,auVar27);
    local_180 = (float)auVar27._0_8_;
    testing::internal::CmpHelperEQ<float,float>(local_148,"ab","dab",&local_17c,&local_180);
    if (local_148[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_188);
      message = "";
      if (local_140.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        message = ((local_140.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x3b4,message);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (((local_188.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar13 = testing::internal::IsTrue(true), bVar13)) &&
         (local_188.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_188.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78 = local_78 + 2;
    local_150 = local_150 + 0x15c2dfb2ce8d75e2;
    local_158 = local_158 + -0x4f97c06442806a0;
    local_88 = local_88 + 0x51c975e2152e6996;
    local_160 = local_160 + -0x1eb8b5a9073ed39c;
    local_168 = local_168 + 0x68efa87f0beceb2a;
    local_90 = local_90 + 0x119b6ffea721d0c8;
    local_98 = local_98 + -0x27f952b178618062;
    local_a0 = local_a0 + 0x571290d167609f8c;
    local_a8 = local_a8 + -0x5fad4c4fda9f9c0e;
    local_b0 = local_b0 + 0x3516fef1b4dde9b0;
    local_b8 = local_b8 + 0x41fabb6874eecd26;
    local_c0 = local_c0 + 0x60e0b608522fd834;
    local_c8 = local_c8 + -0x71f99dac5a85d7c6;
    local_d0 = local_d0 + -0x689413737f6b53e8;
    local_d8 = local_d8 + -0x7e9ce66163b5a5d2;
    local_80 = local_80 + -0x4f5c17a566d501a4;
    local_e0 = local_e0 + 0x7fb5d329728ea185;
  } while (local_78 != 0x30d41);
  return;
}

Assistant:

TEST(Math, InnerProduct) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a[4] = {r(), r(), r(), r()};
        Float b[4] = {r(), r(), r(), r()};
        Float ab = (Float)InnerProduct(a[0], b[0], a[1], b[1], a[2], b[2], a[3], b[3]);
        Float dab = double(a[0]) * double(b[0]) + double(a[1]) * double(b[1]) +
                    double(a[2]) * double(b[2]) + double(a[3]) * double(b[3]);
        EXPECT_EQ(ab, dab);
    }
}